

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int64_t stdin_reader(exr_const_context_t file,void *userdata,void *buffer,uint64_t sz,
                    uint64_t offset,exr_stream_error_func_ptr_t error_cb)

{
  size_t in_RCX;
  void *in_RDX;
  undefined8 in_RDI;
  uint64_t in_R8;
  code *in_R9;
  int64_t nread;
  ssize_t local_8;
  
  if (in_R8 == stdin_reader::lastoffset) {
    local_8 = read(0,in_RDX,in_RCX);
    if (0 < local_8) {
      stdin_reader::lastoffset = in_R8 + local_8;
    }
  }
  else {
    (*in_R9)(in_RDI,10,"Unable to seek in stdin stream");
    local_8 = -1;
  }
  return local_8;
}

Assistant:

static int64_t
stdin_reader (
    exr_const_context_t         file,
    void*                       userdata,
    void*                       buffer,
    uint64_t                    sz,
    uint64_t                    offset,
    exr_stream_error_func_ptr_t error_cb)
{
    static uint64_t lastoffset = 0;
    int64_t         nread      = 0;

    (void) userdata;

    if (offset != lastoffset)
    {
        error_cb (file, EXR_ERR_READ_IO, "Unable to seek in stdin stream");
        return -1;
    }
#ifdef _WIN32
    if (sz >= (size_t) (INT32_MAX))
    {
        error_cb (
            file, EXR_ERR_READ_IO, "Read request too large for win32 API");
        return -1;
    }
    nread = _read (_fileno (stdin), buffer, (unsigned) sz);
#else
    nread = read (STDIN_FILENO, buffer, sz);
#endif
    if (nread > 0) lastoffset = offset + (uint64_t) nread;
    return nread;
}